

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pid.c
# Opt level: O1

void PID_Regular_Cacl(PID_Regular_t *PID_Regular)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar2 = PID_Regular->Ref - PID_Regular->Feedback;
  fVar3 = PID_Regular->MaxInt;
  fVar1 = PID_Regular->Error;
  PID_Regular->PrevError = PID_Regular->LastError;
  PID_Regular->LastError = fVar1;
  PID_Regular->Error = fVar2;
  fVar4 = PID_Regular->IntError + fVar2;
  if ((fVar3 < fVar4) || (fVar3 = -fVar3, fVar4 < fVar3)) {
    fVar4 = fVar3;
  }
  PID_Regular->IntError = fVar4;
  fVar4 = (fVar2 * PID_Regular->Kp + fVar4 * PID_Regular->Ki) - (fVar2 - fVar1) * PID_Regular->Kd;
  fVar3 = PID_Regular->MaxOutput;
  fVar1 = fVar3;
  if ((fVar3 < fVar4) || (fVar1 = -fVar3, fVar4 < -fVar3)) {
    fVar4 = fVar1;
  }
  PID_Regular->Output = fVar4;
  return;
}

Assistant:

void PID_Regular_Cacl(PID_Regular_t *PID_Regular)
{
	static float Error = 0.0f, Integrate = 0.0f, Delta = 0.0f, Output = 0.0f;
	Error = PID_Regular->Ref - PID_Regular->Feedback;
	Delta = Error - PID_Regular->Error;
	PID_Regular->PrevError = PID_Regular->LastError;
	PID_Regular->LastError = PID_Regular->Error;
	PID_Regular->Error = Error;
	Integrate = Error + PID_Regular->IntError;
	absLimit(&Integrate, PID_Regular->MaxInt);
	PID_Regular->IntError = Integrate;
	Output = PID_Regular->Kp * Error + PID_Regular->Ki * Integrate - PID_Regular->Kd * Delta;
	absLimit(&Output, PID_Regular->MaxOutput);
	PID_Regular->Output = Output;
}